

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_func_get_arg(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  jx9_vm *pjVar2;
  VmFrame *pVVar3;
  void *pvVar4;
  int iVar5;
  
  if (0 < nArg) {
    pjVar2 = pCtx->pVm;
    pVVar3 = pjVar2->pFrame;
    if (pVVar3->pParent != (VmFrame *)0x0) {
      iVar5 = jx9_value_to_int(*apArg);
      if ((((-1 < iVar5) && (iVar5 < (int)(pVVar3->sArg).nUsed)) &&
          (pvVar4 = (pVVar3->sArg).pBase, pvVar4 != (void *)0x0)) &&
         ((uVar1 = *(uint *)((long)pvVar4 + (ulong)(iVar5 * (pVVar3->sArg).eSize)),
          uVar1 < (pjVar2->aMemObj).nUsed &&
          (pvVar4 = (pjVar2->aMemObj).pBase, pvVar4 != (void *)0x0)))) {
        jx9_result_value(pCtx,(jx9_value *)((long)pvVar4 + (ulong)(uVar1 * (pjVar2->aMemObj).eSize))
                        );
        return 0;
      }
      goto LAB_0012707f;
    }
  }
  jx9_context_throw_error(pCtx,2,"Called in the global scope");
LAB_0012707f:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int vm_builtin_func_get_arg(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pObj = 0;
	VmSlot *pSlot = 0;
	VmFrame *pFrame;
	jx9_vm *pVm;
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Current frame */
	pFrame = pVm->pFrame;
	if( nArg < 1 || pFrame->pParent == 0 ){
		/* Global frame or Missing arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Called in the global scope");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract the desired index */
	nArg = jx9_value_to_int(apArg[0]);
	if( nArg < 0 || nArg >= (int)SySetUsed(&pFrame->sArg) ){
		/* Invalid index, return FALSE */
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract the desired argument */
	if( (pSlot = (VmSlot *)SySetAt(&pFrame->sArg, (sxu32)nArg)) != 0 ){
		if( (pObj = (jx9_value *)SySetAt(&pVm->aMemObj, pSlot->nIdx)) != 0 ){
			/* Return the desired argument */
			jx9_result_value(pCtx, (jx9_value *)pObj);
		}else{
			/* No such argument, return false */
			jx9_result_bool(pCtx, 0);
		}
	}else{
		/* CAN'T HAPPEN */
		jx9_result_bool(pCtx, 0);
	}
	return SXRET_OK;
}